

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetimepicker.cpp
# Opt level: O0

void __thiscall QtMWidgets::DateTimePicker::setTime(DateTimePicker *this,QTime *time)

{
  QTime QVar1;
  ulong uVar2;
  DateTimePickerPrivate *this_00;
  QDate *pQVar3;
  DateTimePickerPrivate *pDVar4;
  QScopedPointer<QtMWidgets::DateTimePickerPrivate,_QScopedPointerDeleter<QtMWidgets::DateTimePickerPrivate>_>
  *this_01;
  QDateTime local_20 [8];
  QTime *local_18;
  QTime *time_local;
  DateTimePicker *this_local;
  
  local_18 = time;
  time_local = (QTime *)this;
  uVar2 = QTime::isValid();
  if ((uVar2 & 1) != 0) {
    this_01 = &this->d;
    this_00 = QScopedPointer<QtMWidgets::DateTimePickerPrivate,_QScopedPointerDeleter<QtMWidgets::DateTimePickerPrivate>_>
              ::operator->(this_01);
    QScopedPointer<QtMWidgets::DateTimePickerPrivate,_QScopedPointerDeleter<QtMWidgets::DateTimePickerPrivate>_>
    ::operator->(this_01);
    pQVar3 = (QDate *)QDateTime::date();
    QVar1.mds = local_18->mds;
    pDVar4 = QScopedPointer<QtMWidgets::DateTimePickerPrivate,_QScopedPointerDeleter<QtMWidgets::DateTimePickerPrivate>_>
             ::operator->(this_01);
    QDateTime::QDateTime(local_20,pQVar3,QVar1,pDVar4->spec,0);
    DateTimePickerPrivate::setValue(this_00,local_20,true);
    QDateTime::~QDateTime(local_20);
  }
  return;
}

Assistant:

void
DateTimePicker::setTime( const QTime & time )
{
	if( time.isValid() )
		d->setValue( QDateTime( d->value.date(), time, d->spec ) );
}